

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::add_a_c(CPU *this)

{
  add_r8_r8(this,&this->regs->a,this->regs->c);
  return 1;
}

Assistant:

int CPU::add_a_c() {
    add_r8_r8(regs.a, regs.c);
    return 1;
}